

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int recvuntilstr(SOCKET sock,char *recvbuf,char *endstr,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  bool bVar4;
  int local_34;
  int Bytes;
  int BytesReceived;
  int *pBytesReceived_local;
  int maxrecvbuflen_local;
  char *endstr_local;
  char *recvbuf_local;
  SOCKET sock_local;
  
  local_34 = 0;
  while( true ) {
    bVar4 = true;
    if (0 < local_34) {
      pcVar2 = strstr(recvbuf,endstr);
      bVar4 = pcVar2 == (char *)0x0;
    }
    if (!bVar4) {
      *pBytesReceived = local_34;
      return 0;
    }
    if (maxrecvbuflen <= local_34) {
      *pBytesReceived = local_34;
      return 6;
    }
    sVar3 = recv(sock,recvbuf + local_34,1,0);
    iVar1 = (int)sVar3;
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      *pBytesReceived = local_34;
      return 2;
    }
    local_34 = iVar1 + local_34;
  }
  *pBytesReceived = local_34;
  return 1;
}

Assistant:

inline int recvuntilstr(SOCKET sock, char* recvbuf, char* endstr, int maxrecvbuflen, int* pBytesReceived)
{
	int BytesReceived = 0;
	int Bytes = 0;

	// Receive byte per byte.
	while ((BytesReceived <= 0)||(strstr(recvbuf, endstr) == NULL))
	{
		if (BytesReceived >= maxrecvbuflen)
		{
			PRINT_DEBUG_ERROR_OSNET(("recvuntilstr error (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
				strtime_m(), 
				"recvbuf full. ", 
				(int)sock, recvbuf, endstr, maxrecvbuflen));
			PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
			*pBytesReceived = BytesReceived;
			return EXIT_OUT_OF_MEMORY;
		}

		// Receive 1 byte.
		Bytes = recv(sock, recvbuf + BytesReceived, 1, 0);
		if (Bytes >= 0)
		{
			if (Bytes == 0)
			{
				PRINT_DEBUG_WARNING_OSNET(("recvuntilstr warning (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
					strtime_m(), 
					szOSUtilsErrMsgs[EXIT_TIMEOUT], 
					(int)sock, recvbuf, endstr, maxrecvbuflen));
				PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
				*pBytesReceived = BytesReceived;
				return EXIT_TIMEOUT;
			}
			else
			{
				PRINT_DEBUG_MESSAGE_OSNET(("Bytes received : %d\n", Bytes));
			}
		}
		else
		{
			PRINT_DEBUG_ERROR_OSNET(("recvuntilstr error (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
				strtime_m(), 
				WSAGetLastErrorMsg(), 
				(int)sock, recvbuf, endstr, maxrecvbuflen));
			PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
			*pBytesReceived = BytesReceived;
			return EXIT_FAILURE;
		}

		BytesReceived += Bytes;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));

	*pBytesReceived = BytesReceived;

	return EXIT_SUCCESS;
}